

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O3

QPointF __thiscall QWidget::mapFrom(QWidget *this,QWidget *parent,QPointF *pos)

{
  undefined4 uVar1;
  undefined4 uVar2;
  qreal qVar3;
  qreal qVar4;
  QPointF QVar5;
  
  qVar3 = pos->xp;
  qVar4 = pos->yp;
  if (parent != (QWidget *)0x0) {
    do {
      if (this == parent) goto LAB_00300469;
      uVar1 = (this->data->crect).x1;
      uVar2 = (this->data->crect).y1;
      qVar3 = qVar3 - (double)(int)uVar1;
      qVar4 = qVar4 - (double)(int)uVar2;
      this = *(QWidget **)(*(long *)&this->field_0x8 + 0x10);
    } while (this != (QWidget *)0x0);
    mapFrom();
  }
LAB_00300469:
  QVar5.yp = qVar4;
  QVar5.xp = qVar3;
  return QVar5;
}

Assistant:

QPointF QWidget::mapFrom(const QWidget *parent, const QPointF &pos) const
{
    QPointF p(pos);
    if (parent) {
        const QWidget * w = this;
        while (w != parent) {
            p = w->mapFromParent(p);
            w = w->parentWidget();
            if (!w) {
                qWarning("QWidget::mapFrom(): parent must be in parent hierarchy");
                break;
            }
        }
    }
    return p;
}